

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::on_port_mapping
          (session_impl *this,port_mapping_t mapping,address *external_ip,int port,
          portmap_protocol proto,error_code *ec,portmap_transport transport,listen_socket_handle *ls
          )

{
  listen_socket_t *args_2;
  int iVar1;
  address *ip;
  bool bVar2;
  ip_voter *this_00;
  value_type *pvVar3;
  address local_a0;
  address local_80;
  ip_source_t local_59;
  address local_58;
  listen_socket_t *local_38;
  listen_socket_t *listen_socket;
  error_code *ec_local;
  portmap_protocol proto_local;
  address *paStack_20;
  int port_local;
  address *external_ip_local;
  session_impl *this_local;
  port_mapping_t mapping_local;
  
  listen_socket = (listen_socket_t *)ec;
  ec_local._3_1_ = proto;
  ec_local._4_4_ = port;
  paStack_20 = external_ip;
  external_ip_local = (address *)this;
  this_local._4_4_ = mapping.m_val;
  local_38 = listen_socket_handle::get(ls);
  bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)listen_socket);
  if ((bVar2) &&
     (bVar2 = alert_manager::should_post<libtorrent::portmap_error_alert>(&this->m_alerts),
     args_2 = listen_socket, bVar2)) {
    if (local_38 == (listen_socket_t *)0x0) {
      boost::asio::ip::address::address(&local_58);
    }
    else {
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                (&local_58,&local_38->local_endpoint);
    }
    alert_manager::
    emplace_alert<libtorrent::portmap_error_alert,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>const&,libtorrent::portmap_transport_const&,boost::system::error_code_const&,boost::asio::ip::address>
              (&this->m_alerts,
               (strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)((long)&this_local + 4),
               &transport,(error_code *)args_2,&local_58);
  }
  if (local_38 == (listen_socket_t *)0x0) {
    return;
  }
  bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)listen_socket);
  if ((!bVar2) &&
     (bVar2 = boost::asio::ip::address::is_unspecified(paStack_20), ip = paStack_20, !bVar2)) {
    this_00 = &local_38->external_address;
    local_59.m_val = '\x10';
    boost::asio::ip::address::address(&local_80);
    ip_voter::cast_vote(this_00,ip,local_59,&local_80);
  }
  if (ec_local._3_1_ == tcp) {
    pvVar3 = container_wrapper<libtorrent::aux::listen_port_mapping,_libtorrent::portmap_transport,_std::array<libtorrent::aux::listen_port_mapping,_2UL>_>
             ::operator[](&local_38->tcp_port_mapping,transport);
    bVar2 = strong_typedef<int,_libtorrent::port_mapping_tag,_void>::operator==
                      (&pvVar3->mapping,
                       (strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)
                       ((long)&this_local + 4));
    iVar1 = ec_local._4_4_;
    if (bVar2) {
      pvVar3 = container_wrapper<libtorrent::aux::listen_port_mapping,_libtorrent::portmap_transport,_std::array<libtorrent::aux::listen_port_mapping,_2UL>_>
               ::operator[](&local_38->tcp_port_mapping,transport);
      pvVar3->port = iVar1;
      goto LAB_0059cb43;
    }
  }
  if (ec_local._3_1_ == udp) {
    pvVar3 = container_wrapper<libtorrent::aux::listen_port_mapping,_libtorrent::portmap_transport,_std::array<libtorrent::aux::listen_port_mapping,_2UL>_>
             ::operator[](&local_38->udp_port_mapping,transport);
    bVar2 = strong_typedef<int,_libtorrent::port_mapping_tag,_void>::operator==
                      (&pvVar3->mapping,
                       (strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)
                       ((long)&this_local + 4));
    iVar1 = ec_local._4_4_;
    if (bVar2) {
      pvVar3 = container_wrapper<libtorrent::aux::listen_port_mapping,_libtorrent::portmap_transport,_std::array<libtorrent::aux::listen_port_mapping,_2UL>_>
               ::operator[](&local_38->udp_port_mapping,transport);
      pvVar3->port = iVar1;
    }
  }
LAB_0059cb43:
  bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)listen_socket);
  if ((!bVar2) &&
     (bVar2 = alert_manager::should_post<libtorrent::portmap_alert>(&this->m_alerts), bVar2)) {
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
              (&local_a0,&local_38->local_endpoint);
    alert_manager::
    emplace_alert<libtorrent::portmap_alert,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>const&,int&,libtorrent::portmap_transport_const&,libtorrent::portmap_protocol_const&,boost::asio::ip::address>
              (&this->m_alerts,
               (strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)((long)&this_local + 4),
               (int *)((long)&ec_local + 4),&transport,(portmap_protocol *)((long)&ec_local + 3),
               &local_a0);
  }
  return;
}

Assistant:

void session_impl::on_port_mapping(port_mapping_t const mapping
		, address const& external_ip, int port
		, portmap_protocol const proto, error_code const& ec
		, portmap_transport const transport
		, listen_socket_handle const& ls)
	{
		TORRENT_ASSERT(is_single_thread());

		listen_socket_t* listen_socket = ls.get();

		// NOTE: don't assume that if ec != 0, the rest of the logic
		// is not necessary, the ports still need to be set, in other
		// words, don't early return without careful review of the
		// remaining logic
		if (ec && m_alerts.should_post<portmap_error_alert>())
		{
			m_alerts.emplace_alert<portmap_error_alert>(mapping
				, transport, ec, listen_socket ? listen_socket->local_endpoint.address() : address());
		}

		if (!listen_socket) return;

		if (!ec && !external_ip.is_unspecified())
		{
			// TODO: 1 report the proper address of the router as the source IP of
			// this vote of our external address, instead of the empty address
			listen_socket->external_address.cast_vote(external_ip, source_router, address());
		}

		// need to check whether this mapping is for one of session ports (it could also be a user mapping)
		if ((proto == portmap_protocol::tcp) && (listen_socket->tcp_port_mapping[transport].mapping == mapping))
			listen_socket->tcp_port_mapping[transport].port = port;
		else if ((proto == portmap_protocol::udp) && (listen_socket->udp_port_mapping[transport].mapping == mapping))
			listen_socket->udp_port_mapping[transport].port = port;

		if (!ec && m_alerts.should_post<portmap_alert>())
		{
			m_alerts.emplace_alert<portmap_alert>(mapping, port
				, transport, proto, listen_socket->local_endpoint.address());
		}
	}